

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
::ReadColumnSizes<false>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<DimensionPrinter>_>
           *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong local_38 [2];
  ArgList local_28;
  
  iVar1 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  uVar3 = iVar1 - 1;
  uVar2 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if (uVar2 != uVar3) {
    local_38[0] = (ulong)uVar3;
    local_28.types_ = 2;
    local_28.field_1.values_ = (Value *)local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x13a061,&local_28);
  }
  if (1 < iVar1) {
    do {
      BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}